

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O3

void __thiscall Refal2::CQualifierBuilder::AddL(CQualifierBuilder *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = DAT_001492f8;
  uVar2 = AnsiL;
  uVar1 = (this->ansichars).super__Base_bitset<2UL>._M_w[0];
  if (this->negative == true) {
    uVar6 = ~DAT_001492f8;
    uVar4 = (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[0];
    uVar5 = (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[1];
    (this->ansichars).super__Base_bitset<2UL>._M_w[0] = uVar1 & (~AnsiL | uVar4);
    uVar6 = (uVar6 | uVar5) & (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  }
  else {
    uVar4 = (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[0];
    uVar5 = (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[1];
    uVar6 = ~uVar5 & DAT_001492f8;
    (this->ansichars).super__Base_bitset<2UL>._M_w[0] = uVar1 | ~uVar4 & AnsiL;
    uVar6 = uVar6 | (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  }
  (this->ansichars).super__Base_bitset<2UL>._M_w[1] = uVar6;
  (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[0] = uVar4 | uVar2;
  (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[1] = uVar5 | uVar3;
  return;
}

Assistant:

void CQualifierBuilder::AddL()
{
	if( negative ) {
		ansichars &= ~AnsiL | ansicharsFixed;
	} else {
		ansichars |= AnsiL & ~ansicharsFixed;
	}
	ansicharsFixed |= AnsiL;
}